

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O2

void __thiscall cmRST::ProcessDirectiveTocTree(cmRST *this)

{
  pointer pbVar1;
  bool bVar2;
  pointer s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar1 = (this->MarkupLines).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (s = (this->MarkupLines).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start; s != pbVar1; s = s + 1) {
    if ((s->_M_string_length != 0) && (*(s->_M_dataplus)._M_p != ':')) {
      bVar2 = cmsys::RegularExpression::find(&this->TocTreeLink,s);
      if (bVar2) {
        cmsys::RegularExpressionMatch::match_abi_cxx11_(&local_70,&(this->TocTreeLink).regmatch,1);
        std::operator+(&local_90,&local_70,".rst");
        ProcessInclude(this,&local_90,IncludeTocTree);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_70);
      }
      else {
        std::operator+(&local_50,s,".rst");
        ProcessInclude(this,&local_50,IncludeTocTree);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
  }
  return;
}

Assistant:

void cmRST::ProcessDirectiveTocTree()
{
  // Process documents referenced by toctree directive.
  for (std::string const& line : this->MarkupLines) {
    if (!line.empty() && line[0] != ':') {
      if (this->TocTreeLink.find(line)) {
        std::string const& link = this->TocTreeLink.match(1);
        this->ProcessInclude(link + ".rst", IncludeTocTree);
      } else {
        this->ProcessInclude(line + ".rst", IncludeTocTree);
      }
    }
  }
}